

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O3

bool __thiscall
Jinx::Impl::Library::RegisterPropertyNameInternal
          (Library *this,PropertyName *propertyName,bool checkForDuplicates)

{
  iterator iVar1;
  undefined7 in_register_00000011;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>
  local_a0;
  
  if (((int)CONCAT71(in_register_00000011,checkForDuplicates) != 0) &&
     (iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
              ::find(&(this->m_propertyNameTable)._M_t,&propertyName->m_name),
     (_Rb_tree_header *)iVar1._M_node !=
     &(this->m_propertyNameTable)._M_t._M_impl.super__Rb_tree_header)) {
    return false;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName,_true>
            (&local_a0,&propertyName->m_name,propertyName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>,4096ul,16ul>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::Impl::PropertyName>>
            ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>,std::_Select1st<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>,4096ul,16ul>>
              *)&this->m_propertyNameTable,&local_a0);
  Variant::~Variant(&local_a0.second.m_defaultValue);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_a0.second.m_name._M_dataplus._M_p != &local_a0.second.m_name.field_2) {
    MemFree(local_a0.second.m_name._M_dataplus._M_p,
            local_a0.second.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
    MemFree(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1);
  }
  if (this->m_maxPropertyParts < propertyName->m_partCount) {
    this->m_maxPropertyParts = propertyName->m_partCount;
  }
  return true;
}

Assistant:

inline_t bool Library::RegisterPropertyNameInternal(const PropertyName & propertyName, bool checkForDuplicates)
	{
		if (checkForDuplicates && (m_propertyNameTable.find(propertyName.GetName()) != m_propertyNameTable.end()))
			return false;
		m_propertyNameTable.insert(std::make_pair(propertyName.GetName(), propertyName));
		if (propertyName.GetPartCount() > m_maxPropertyParts)
			m_maxPropertyParts = propertyName.GetPartCount();
		return true;
	}